

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

char * coda_stristr(char *s,char *n)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  __int32_t *p_Var4;
  __int32_t **pp_Var5;
  long lVar6;
  char cVar7;
  
  if ((s != (char *)0x0) && (cVar7 = *s, cVar7 != '\0')) {
    if (n == (char *)0x0) {
      return s;
    }
    cVar2 = *n;
    if ((long)cVar2 == 0) {
      return s;
    }
    while (cVar7 != '\0') {
      pp_Var5 = __ctype_tolower_loc();
      p_Var4 = *pp_Var5;
      lVar6 = 1;
      if (p_Var4[cVar7] == p_Var4[cVar2]) {
        while( true ) {
          cVar3 = n[lVar6 + -1];
          if (cVar7 == '\0') break;
          if (cVar3 == '\0') {
            return s;
          }
          if (p_Var4[cVar7] != p_Var4[cVar3]) goto LAB_0010602d;
          cVar7 = s[lVar6];
          lVar6 = lVar6 + 1;
        }
        if (cVar3 == '\0') {
          return s;
        }
      }
LAB_0010602d:
      pcVar1 = s + 1;
      s = s + 1;
      cVar7 = *pcVar1;
    }
  }
  return (char *)0x0;
}

Assistant:

char *coda_stristr(const char *s, const char *n)
{
	const char *w;
	const char *x;

	if (!s || !*s) return NULL;
	if (!n || !*n) return (char *) s;

	for (; *s; ++s)
	{
		if (tolower(*s) == tolower(*n))
		{
			for (w = s, x = n; *w && *x; ++w, ++x)
			{
				if (tolower(*w) != tolower(*x)) break;
			}

			if (!*x) return (char *) s;
		}
	}

	return NULL;
}